

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# traverser_base.h
# Opt level: O0

void __thiscall
draco::
TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
::Init(TraverserBase<draco::MeshAttributeCornerTable,_draco::MeshAttributeIndicesEncodingObserver<draco::MeshAttributeCornerTable>_>
       *this,CornerTable *corner_table,TraversalObserver traversal_observer)

{
  size_type __n;
  vector<bool,_std::allocator<bool>_> *this_00;
  undefined8 in_RSI;
  long in_RDI;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  undefined8 in_stack_00000020;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffffd0;
  
  *(undefined8 *)(in_RDI + 8) = in_RSI;
  __n = in_RDI + 0x30;
  MeshAttributeCornerTable::num_faces((MeshAttributeCornerTable *)0x16147d);
  std::vector<bool,_std::allocator<bool>_>::assign(in_stack_ffffffffffffffd0,__n,(bool *)0x161493);
  this_00 = (vector<bool,_std::allocator<bool>_> *)(in_RDI + 0x58);
  MeshAttributeCornerTable::num_vertices((MeshAttributeCornerTable *)0x1614ad);
  std::vector<bool,_std::allocator<bool>_>::assign(this_00,__n,(bool *)0x1614c4);
  *(undefined8 *)(in_RDI + 0x10) = in_stack_00000008;
  *(undefined8 *)(in_RDI + 0x18) = in_stack_00000010;
  *(undefined8 *)(in_RDI + 0x20) = in_stack_00000018;
  *(undefined8 *)(in_RDI + 0x28) = in_stack_00000020;
  return;
}

Assistant:

virtual void Init(const CornerTable *corner_table,
                    TraversalObserver traversal_observer) {
    corner_table_ = corner_table;
    is_face_visited_.assign(corner_table->num_faces(), false);
    is_vertex_visited_.assign(corner_table_->num_vertices(), false);
    traversal_observer_ = traversal_observer;
  }